

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexEnumerator.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator
          (ES5ArrayIndexEnumerator *this,ES5Array *arrayObject,EnumeratorFlags flags,
          ScriptContext *scriptContext)

{
  ScriptContext *scriptContext_local;
  EnumeratorFlags flags_local;
  ES5Array *arrayObject_local;
  ES5ArrayIndexEnumerator *this_local;
  
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,&arrayObject->super_JavascriptArray,
             flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dff430;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptor>::WriteBarrierPtr(&this->descriptor);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->descriptorValidationToken);
  (*(this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
  return;
}

Assistant:

ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator(ES5Array* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext)
        : JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext)
    {
        Reset();
    }